

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_bridge.cpp
# Opt level: O2

int AF_ACustomBridge_A_BridgeInit
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  int iVar3;
  VMValue *pVVar4;
  PClassActor *type;
  AActor *self;
  AActor *this;
  char *pcVar5;
  int iVar6;
  int iVar7;
  double local_58;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004a7775;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004a7765:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004a7775:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                  ,0x7f,
                  "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AActor *)0x0) goto LAB_004a7633;
    bVar2 = DObject::IsKindOf((DObject *)this,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_004a7775;
    }
  }
  else {
    if (this != (AActor *)0x0) goto LAB_004a7765;
LAB_004a7633:
    this = (AActor *)0x0;
  }
  if (numparam != 1) {
    if (param[1].field_0.field_3.Type == '\x03') {
      pVVar4 = param + 1;
      if (param[1].field_0.field_1.atag == 1) goto LAB_004a7675;
      if ((pVVar4->field_0).field_1.a == (void *)0x0) goto LAB_004a7689;
    }
    pcVar5 = 
    "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
    ;
    goto LAB_004a7792;
  }
  pVVar1 = defaultparam->Array;
  if (pVVar1[1].field_0.field_3.Type != '\x03') {
LAB_004a7653:
    pcVar5 = 
    "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
    ;
LAB_004a7792:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_bridge.cpp"
                  ,0x80,
                  "int AF_ACustomBridge_A_BridgeInit(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pVVar4 = pVVar1 + 1;
  if (pVVar1[1].field_0.field_1.atag == 1) {
LAB_004a7675:
    type = (PClassActor *)(pVVar4->field_0).field_1.a;
    if (type != (PClassActor *)0x0) goto LAB_004a7698;
  }
  else if ((pVVar4->field_0).field_1.a != (void *)0x0) goto LAB_004a7653;
LAB_004a7689:
  type = PClass::FindActor("BridgeBall");
LAB_004a7698:
  iVar3 = FRandom::operator()(&pr_orbit);
  iVar6 = 3;
  if (this->args[2] != 0) {
    iVar6 = this->args[2];
  }
  iVar7 = 0;
  if (0 < iVar6) {
    iVar7 = iVar6;
  }
  local_58 = 0.0;
  while (bVar2 = iVar7 != 0, iVar7 = iVar7 + -1, bVar2) {
    local_48.X = (this->__Pos).X;
    local_48.Y = (this->__Pos).Y;
    local_48.Z = (this->__Pos).Z;
    self = Spawn(type,&local_48,ALLOW_REPLACE);
    (self->Angles).Yaw.Degrees =
         (double)(int)(0x100 / (long)iVar6) * 1.40625 * local_58 + (double)iVar3 * 1.40625;
    (self->target).field_0.p = this;
    BridgeOrbit(self);
    local_58 = local_58 + 1.0;
  }
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(ACustomBridge, A_BridgeInit)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(balltype, AActor);

	AActor *ball;

	if (balltype == NULL)
	{
		balltype = PClass::FindActor("BridgeBall");
	}

	DAngle startangle = pr_orbit() * (360./256.);

	// Spawn triad into world -- may be more than a triad now.
	int ballcount = self->args[2]==0 ? 3 : self->args[2];

	for (int i = 0; i < ballcount; i++)
	{
		ball = Spawn(balltype, self->Pos(), ALLOW_REPLACE);
		ball->Angles.Yaw = startangle + (45./32) * (256/ballcount) * i;
		ball->target = self;
		BridgeOrbit(ball);
	}
	return 0;
}